

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_inertia.cpp
# Opt level: O1

Read<signed_char>
Omega_h::inertia::anon_unknown_0::mark_bisection_internal
          (CommPtr *comm,Reals *coords,Reals *masses,Real tolerance,Vector<3> axis,Vector<3> center,
          Real total_mass)

{
  int *piVar1;
  void **ppvVar2;
  element_type *this;
  Vector<3> axis_00;
  Alloc *pAVar3;
  byte bVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  ulong *in_RCX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  void *extraout_RDX_06;
  void *extraout_RDX_07;
  void *extraout_RDX_08;
  void *pvVar8;
  void *extraout_RDX_09;
  ulong uVar9;
  byte bVar10;
  Read<signed_char> RVar11;
  Read<signed_char> *marked;
  Reals dists;
  Vector<3> axis2;
  Reals local_110;
  Reals *local_100;
  Reals *local_f8;
  Reals *local_f0;
  Real local_e8;
  Real local_e0;
  Reals local_d8;
  Reals local_c8;
  Alloc *local_b8;
  void *local_b0;
  Reals local_a8;
  CommPtr local_98;
  Reals local_88;
  CommPtr local_78;
  Reals local_68;
  double local_58 [3];
  Alloc *local_40;
  void *local_38;
  
  local_40 = (masses->write_).shared_alloc_.alloc;
  if (((ulong)local_40 & 7) == 0 && local_40 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_40 = (Alloc *)(local_40->size * 8 + 1);
    }
    else {
      local_40->use_count = local_40->use_count + 1;
    }
  }
  local_38 = (masses->write_).shared_alloc_.direct_ptr;
  local_f8 = masses;
  local_f0 = coords;
  local_e8 = tolerance;
  local_e0 = total_mass;
  get_distances(&local_110,center,axis);
  pAVar3 = local_40;
  if (((ulong)local_40 & 7) == 0 && local_40 != (Alloc *)0x0) {
    piVar1 = &local_40->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_40);
      operator_delete(pAVar3,0x48);
    }
  }
  (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0
  ;
  (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_78.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(local_f0->write_).shared_alloc_.alloc;
  local_78.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_f0->write_).shared_alloc_.direct_ptr;
  if (local_78.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_78.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_78.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_78.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_78.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_a8.write_.shared_alloc_.alloc = local_110.write_.shared_alloc_.alloc;
  if (((ulong)local_110.write_.shared_alloc_.alloc & 7) == 0 &&
      local_110.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a8.write_.shared_alloc_.alloc =
           (Alloc *)((local_110.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_110.write_.shared_alloc_.alloc)->use_count =
           (local_110.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_a8.write_.shared_alloc_.direct_ptr = local_110.write_.shared_alloc_.direct_ptr;
  local_88.write_.shared_alloc_.alloc = (Alloc *)*in_RCX;
  if (((ulong)local_88.write_.shared_alloc_.alloc & 7) == 0 &&
      local_88.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_88.write_.shared_alloc_.alloc =
           (Alloc *)((local_88.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_88.write_.shared_alloc_.alloc)->use_count =
           (local_88.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_88.write_.shared_alloc_.direct_ptr = (void *)in_RCX[1];
  bVar5 = mark_axis_bisection(&local_78,&local_a8,&local_88,local_e0,local_e8,
                              (Read<signed_char> *)comm);
  pAVar3 = local_88.write_.shared_alloc_.alloc;
  pvVar8 = extraout_RDX;
  if (((ulong)local_88.write_.shared_alloc_.alloc & 7) == 0 &&
      local_88.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_88.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_88.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
      pvVar8 = extraout_RDX_00;
    }
  }
  pAVar3 = local_a8.write_.shared_alloc_.alloc;
  if (((ulong)local_a8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_a8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_a8.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_a8.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
      pvVar8 = extraout_RDX_01;
    }
  }
  if (local_78.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    pvVar8 = extraout_RDX_02;
  }
  if (!bVar5) {
    bVar5 = false;
    uVar9 = 0;
    bVar4 = 0;
    local_100 = &local_110;
    do {
      bVar10 = bVar4;
      local_58[2] = axis.super_Few<double,_3>.array_[2];
      local_58[0] = axis.super_Few<double,_3>.array_[0];
      local_58[1] = axis.super_Few<double,_3>.array_[1];
      local_58[uVar9 >> 1] =
           *(double *)(&DAT_00455000 + (ulong)((uVar9 & 1) == 0) * 8) + local_58[uVar9 >> 1];
      local_b8 = (local_f8->write_).shared_alloc_.alloc;
      if (((ulong)local_b8 & 7) == 0 && local_b8 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_b8 = (Alloc *)(local_b8->size * 8 + 1);
        }
        else {
          local_b8->use_count = local_b8->use_count + 1;
        }
      }
      local_b0 = (local_f8->write_).shared_alloc_.direct_ptr;
      axis_00.super_Few<double,_3>.array_[1] = local_58[1];
      axis_00.super_Few<double,_3>.array_[0] = local_58[0];
      axis_00.super_Few<double,_3>.array_[2] = local_58[2];
      get_distances(&local_68,center,axis_00);
      pAVar3 = local_110.write_.shared_alloc_.alloc;
      if (((ulong)local_110.write_.shared_alloc_.alloc & 7) == 0 &&
          local_110.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_110.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_110.write_.shared_alloc_.alloc);
          operator_delete(pAVar3,0x48);
        }
      }
      pAVar3 = local_b8;
      local_110.write_.shared_alloc_.alloc = local_68.write_.shared_alloc_.alloc;
      local_110.write_.shared_alloc_.direct_ptr = local_68.write_.shared_alloc_.direct_ptr;
      if ((((ulong)local_68.write_.shared_alloc_.alloc & 7) == 0 &&
           local_68.write_.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
        (local_68.write_.shared_alloc_.alloc)->use_count =
             (local_68.write_.shared_alloc_.alloc)->use_count + -1;
        local_110.write_.shared_alloc_.alloc =
             (Alloc *)((local_68.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      local_68.write_.shared_alloc_.alloc = (Alloc *)0x0;
      local_68.write_.shared_alloc_.direct_ptr = (void *)0x0;
      if (((ulong)local_b8 & 7) == 0 && local_b8 != (Alloc *)0x0) {
        piVar1 = &local_b8->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_b8);
          operator_delete(pAVar3,0x48);
        }
      }
      local_98.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)(local_f0->write_).shared_alloc_.alloc;
      local_98.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (local_f0->write_).shared_alloc_.direct_ptr;
      if (local_98.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_98.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ->_M_use_count =
               (local_98.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_98.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ->_M_use_count =
               (local_98.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
        }
      }
      local_c8.write_.shared_alloc_.alloc = local_110.write_.shared_alloc_.alloc;
      if (((ulong)local_110.write_.shared_alloc_.alloc & 7) == 0 &&
          local_110.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_c8.write_.shared_alloc_.alloc =
               (Alloc *)((local_110.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_110.write_.shared_alloc_.alloc)->use_count =
               (local_110.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_c8.write_.shared_alloc_.direct_ptr = local_110.write_.shared_alloc_.direct_ptr;
      local_d8.write_.shared_alloc_.alloc = (Alloc *)*in_RCX;
      if (((ulong)local_d8.write_.shared_alloc_.alloc & 7) == 0 &&
          local_d8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_d8.write_.shared_alloc_.alloc =
               (Alloc *)((local_d8.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_d8.write_.shared_alloc_.alloc)->use_count =
               (local_d8.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_d8.write_.shared_alloc_.direct_ptr = (void *)in_RCX[1];
      bVar6 = mark_axis_bisection(&local_98,&local_c8,&local_d8,local_e0,local_e8,
                                  (Read<signed_char> *)comm);
      pAVar3 = local_d8.write_.shared_alloc_.alloc;
      pvVar8 = extraout_RDX_03;
      if (((ulong)local_d8.write_.shared_alloc_.alloc & 7) == 0 &&
          local_d8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_d8.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_d8.write_.shared_alloc_.alloc);
          operator_delete(pAVar3,0x48);
          pvVar8 = extraout_RDX_04;
        }
      }
      pAVar3 = local_c8.write_.shared_alloc_.alloc;
      if (((ulong)local_c8.write_.shared_alloc_.alloc & 7) == 0 &&
          local_c8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_c8.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_c8.write_.shared_alloc_.alloc);
          operator_delete(pAVar3,0x48);
          pvVar8 = extraout_RDX_05;
        }
      }
      if (local_98.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_98.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        pvVar8 = extraout_RDX_06;
      }
      if (bVar6) break;
      bVar5 = 4 < (uint)uVar9;
      uVar7 = (uint)uVar9 + 1;
      uVar9 = (ulong)uVar7;
      bVar4 = bVar10 | bVar6;
    } while (uVar7 != 6);
    if (bVar5) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Omega_h WARNING: no good inertial bisection\n",0x2c);
      pvVar8 = extraout_RDX_07;
    }
    else if ((bVar10 == 0 && !bVar6) &&
            (this = (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
            ((ulong)this & 7) == 0 && this != (element_type *)0x0)) {
      ppvVar2 = &(this->host_srcs_).read_.write_.shared_alloc_.direct_ptr;
      *(int *)ppvVar2 = *(int *)ppvVar2 + -1;
      if (*(int *)ppvVar2 == 0) {
        Alloc::~Alloc((Alloc *)this);
        operator_delete(this,0x48);
        pvVar8 = extraout_RDX_08;
      }
    }
  }
  pAVar3 = local_110.write_.shared_alloc_.alloc;
  if (((ulong)local_110.write_.shared_alloc_.alloc & 7) == 0 &&
      local_110.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_110.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_110.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
      pvVar8 = extraout_RDX_09;
    }
  }
  RVar11.write_.shared_alloc_.direct_ptr = pvVar8;
  RVar11.write_.shared_alloc_.alloc = (Alloc *)comm;
  return (Read<signed_char>)RVar11.write_.shared_alloc_;
}

Assistant:

Read<I8> mark_bisection_internal(CommPtr comm, Reals coords, Reals masses,
    Real tolerance, Vector<3> axis, Vector<3> center, Real total_mass) {
  auto dists = get_distances(coords, center, axis);
  Read<I8> marked;
  if (mark_axis_bisection(comm, dists, masses, total_mass, tolerance, marked)) {
    return marked;
  }
  // if we couldn't find a decent cutting plane, this may be a highly
  // structured mesh with many points coincident on the cutting plane.
  // perturb the axis vector to escape this scenario
  for (Int i = 0; i < 3 * 2; ++i) {
    auto axis2 = axis;
    axis2[i / 2] += (i % 2) ? 1e-3 : -1e-3;
    dists = get_distances(coords, center, axis2);
    if (mark_axis_bisection(
            comm, dists, masses, total_mass, tolerance, marked)) {
      return marked;
    }
  }
  // even perturbation of the axis could not find a good
  // cutting plane. warn the user of this failure, but continue
  // with the axis that we have, because the cutting plane
  // is still the best we could find.
  // (to date I have not seen this happen, even with > 1 billion elements)
  std::cerr << "Omega_h WARNING: no good inertial bisection\n";
  return marked;
}